

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCompilePDBPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  string dir;
  string name;
  string sStack_78;
  string local_58;
  string local_38;
  
  GetCompilePDBDirectory(&sStack_78,this,config);
  GetCompilePDBName(&local_58,this,config);
  if (sStack_78._M_string_length == 0) {
    if (local_58._M_string_length != 0) {
      bVar1 = HaveWellDefinedOutputFiles(this);
      if (bVar1) {
        GetPDBDirectory(&local_38,this,config);
        std::__cxx11::string::operator=((string *)&sStack_78,(string *)&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
    if (sStack_78._M_string_length == 0) goto LAB_003d3537;
  }
  std::__cxx11::string::append((char *)&sStack_78);
LAB_003d3537:
  std::operator+(__return_storage_ptr__,&sStack_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_78);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBPath(
  const std::string& config) const
{
  std::string dir = this->GetCompilePDBDirectory(config);
  std::string name = this->GetCompilePDBName(config);
  if (dir.empty() && !name.empty() && this->HaveWellDefinedOutputFiles()) {
    dir = this->GetPDBDirectory(config);
  }
  if (!dir.empty()) {
    dir += "/";
  }
  return dir + name;
}